

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O1

void __thiscall sf::priv::ClipboardImpl::ClipboardImpl(ClipboardImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Display *pDVar2;
  Atom AVar3;
  Window WVar4;
  string local_40;
  
  this->m_window = 0;
  String::String(&this->m_clipboardContents);
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<_XEvent,_std::allocator<_XEvent>_>::_M_initialize_map
            (&(this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>,0);
  this->m_requestResponded = false;
  pDVar2 = OpenDisplay();
  this->m_display = pDVar2;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CLIPBOARD","");
  AVar3 = getAtom(&local_40,false);
  this->m_clipboard = AVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TARGETS","");
  AVar3 = getAtom(&local_40,false);
  this->m_targets = AVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TEXT","");
  AVar3 = getAtom(&local_40,false);
  this->m_text = AVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"UTF8_STRING","");
  AVar3 = getAtom(&local_40,true);
  this->m_utf8String = AVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"SFML_CLIPBOARD_TARGET_PROPERTY","");
  AVar3 = getAtom(&local_40,false);
  this->m_targetProperty = AVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pDVar2 = this->m_display;
  WVar4 = XCreateSimpleWindow(pDVar2,*(undefined8 *)
                                      (*(long *)(pDVar2 + 0xe8) + 0x10 +
                                      (long)*(int *)(pDVar2 + 0xe0) * 0x80),0,0,1,1,0,0,0);
  this->m_window = WVar4;
  XSelectInput(this->m_display,WVar4,0x1f);
  return;
}

Assistant:

ClipboardImpl::ClipboardImpl() :
m_window (0),
m_requestResponded(false)
{
    // Open a connection with the X server
    m_display = OpenDisplay();

    // Get the atoms we need to make use of the clipboard
    m_clipboard      = getAtom("CLIPBOARD",                      false);
    m_targets        = getAtom("TARGETS",                        false);
    m_text           = getAtom("TEXT",                           false);
    m_utf8String     = getAtom("UTF8_STRING",                    true );
    m_targetProperty = getAtom("SFML_CLIPBOARD_TARGET_PROPERTY", false);

    // Create a hidden window that will broker our clipboard interactions with X
    m_window = XCreateSimpleWindow(m_display, DefaultRootWindow(m_display), 0, 0, 1, 1, 0, 0, 0);

    // Register the events we are interested in
    XSelectInput(m_display, m_window, SelectionNotify | SelectionClear | SelectionRequest);
}